

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall MidiPlayerDialog::on_addButton_clicked(MidiPlayerDialog *this)

{
  undefined8 uVar1;
  QSettings *pQVar2;
  bool bVar3;
  int iVar4;
  Master *this_00;
  QString *pQVar5;
  undefined1 local_188 [4];
  int row;
  QString local_168;
  QDir local_150 [8];
  QString local_148;
  uint local_130;
  Int local_12c;
  QString local_128;
  QString local_110;
  undefined1 local_f8 [8];
  QStringList fileNames;
  QString local_c0;
  QVariant local_a8;
  QFlag local_88;
  QFlags<QFileDialog::Option> local_84;
  undefined1 local_80 [4];
  Options qFileDialogOptions;
  QString local_50;
  QVariant local_38;
  QSettings *local_18;
  QSettings *settings;
  MidiPlayerDialog *this_local;
  
  settings = (QSettings *)this;
  this_00 = Master::getInstance();
  local_18 = Master::getSettings(this_00);
  if ((on_addButton_clicked()::currentDir == '\0') &&
     (iVar4 = __cxa_guard_acquire(&on_addButton_clicked()::currentDir), pQVar2 = local_18,
     iVar4 != 0)) {
    QString::QString(&local_50,"Master/LastAddMidiFileDir");
    QVariant::QVariant((QVariant *)local_80);
    QSettings::value((QString *)&local_38,(QVariant *)pQVar2);
    QVariant::toString();
    QVariant::~QVariant(&local_38);
    QVariant::~QVariant((QVariant *)local_80);
    QString::~QString(&local_50);
    __cxa_atexit(QString::~QString,&on_addButton_clicked::currentDir,&__dso_handle);
    __cxa_guard_release(&on_addButton_clicked()::currentDir);
  }
  pQVar2 = local_18;
  QString::QString(&local_c0,"Master/qFileDialogOptions");
  QVariant::QVariant((QVariant *)&fileNames.d.size,0);
  QSettings::value((QString *)&local_a8,(QVariant *)pQVar2);
  iVar4 = QVariant::toInt((bool *)&local_a8);
  QFlag::QFlag(&local_88,iVar4);
  QFlags<QFileDialog::Option>::QFlags(&local_84,local_88);
  QVariant::~QVariant(&local_a8);
  QVariant::~QVariant((QVariant *)&fileNames.d.size);
  QString::~QString(&local_c0);
  QString::QString(&local_110,(char *)0x0);
  QString::QString(&local_128,"*.mid *.smf *.syx;;*.mid;;*.smf;;*.syx;;*.*");
  local_12c = local_84.i;
  QFileDialog::getOpenFileNames
            ((QWidget *)local_f8,(QString *)this,(QString *)&local_110,
             (QString *)&on_addButton_clicked::currentDir,(QString *)&local_128,
             (QFlags_conflict1 *)0x0);
  QString::~QString(&local_128);
  QString::~QString(&local_110);
  bVar3 = QList<QString>::isEmpty((QList<QString> *)local_f8);
  if (!bVar3) {
    pQVar5 = QList<QString>::first((QList<QString> *)local_f8);
    QDir::QDir(local_150,(QString *)pQVar5);
    QDir::absolutePath();
    QString::operator=(&on_addButton_clicked::currentDir,&local_148);
    QString::~QString(&local_148);
    QDir::~QDir(local_150);
    pQVar2 = local_18;
    QString::QString(&local_168,"Master/LastAddMidiFileDir");
    QVariant::QVariant((QVariant *)local_188,(QString *)&on_addButton_clicked::currentDir);
    QSettings::setValue((QString *)pQVar2,(QVariant *)&local_168);
    QVariant::~QVariant((QVariant *)local_188);
    QString::~QString(&local_168);
    iVar4 = QListWidget::currentRow();
    QListWidget::insertItems
              ((int)*(undefined8 *)(this->ui + 0x18),(QList_conflict1 *)(ulong)(iVar4 + 1));
    uVar1 = *(undefined8 *)(this->ui + 0x18);
    QList<QString>::count((QList<QString> *)local_f8);
    QListWidget::setCurrentRow((int)uVar1);
    updateCurrentItem(this);
  }
  local_130 = (uint)bVar3;
  QList<QString>::~QList((QList<QString> *)local_f8);
  return;
}

Assistant:

void MidiPlayerDialog::on_addButton_clicked() {
	QSettings *settings = Master::getInstance()->getSettings();
	static QString currentDir = settings->value("Master/LastAddMidiFileDir").toString();
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(settings->value("Master/qFileDialogOptions", 0).toInt());
	QStringList fileNames = QFileDialog::getOpenFileNames(this, NULL, currentDir, "*.mid *.smf *.syx;;*.mid;;*.smf;;*.syx;;*.*",
		NULL, qFileDialogOptions);
	if (fileNames.isEmpty()) return;
	currentDir = QDir(fileNames.first()).absolutePath();
	settings->setValue("Master/LastAddMidiFileDir", currentDir);
	int row = ui->playList->currentRow();
	ui->playList->insertItems(row + 1, fileNames);
	ui->playList->setCurrentRow(row + fileNames.count());
	updateCurrentItem();
}